

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

int PyxmlNodeSet_Convert(PyObject *py_nodeset,xmlNodeSetPtr *result)

{
  bool bVar1;
  int iVar2;
  xmlNodeSetPtr pxVar3;
  xmlNodePtr *ppxVar4;
  PyTypeObject *local_58;
  xmlNodePtr local_50;
  PyTypeObject *local_48;
  int local_40;
  xmlNodePtr pynode;
  int idx;
  int is_tuple;
  xmlNodeSetPtr nodeSet;
  xmlNodeSetPtr *result_local;
  PyObject *py_nodeset_local;
  
  iVar2 = PyType_HasFeature(py_nodeset->ob_type,0x4000000);
  if (iVar2 == 0) {
    iVar2 = PyType_HasFeature(py_nodeset->ob_type,0x2000000);
    if (iVar2 == 0) {
      if (py_nodeset == (PyObject *)&_Py_NoneStruct) {
        *result = (xmlNodeSetPtr)0x0;
        return 0;
      }
      PyErr_SetString(_PyExc_TypeError,"must be a tuple or list of nodes.");
      return -1;
    }
    bVar1 = false;
  }
  else {
    bVar1 = true;
  }
  pxVar3 = (xmlNodeSetPtr)(*_xmlMalloc)(0x10);
  if (pxVar3 == (xmlNodeSetPtr)0x0) {
    PyErr_SetString(_PyExc_MemoryError,"");
    py_nodeset_local._4_4_ = -1;
  }
  else {
    pxVar3->nodeNr = 0;
    if (bVar1) {
      iVar2 = PyType_HasFeature(py_nodeset->ob_type,0x4000000);
      if (iVar2 == 0) {
        __assert_fail("PyTuple_Check(py_nodeset)",
                      "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                      ,0xc9f,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
      }
      local_40 = (int)py_nodeset[1].ob_refcnt;
    }
    else {
      iVar2 = PyType_HasFeature(py_nodeset->ob_type,0x2000000);
      if (iVar2 == 0) {
        __assert_fail("PyList_Check(py_nodeset)",
                      "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                      ,0xca0,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
      }
      local_40 = (int)py_nodeset[1].ob_refcnt;
    }
    pxVar3->nodeMax = local_40;
    ppxVar4 = (xmlNodePtr *)(*_xmlMalloc)((long)pxVar3->nodeMax << 3);
    pxVar3->nodeTab = ppxVar4;
    if (pxVar3->nodeTab == (xmlNodePtr *)0x0) {
      (*_xmlFree)(pxVar3);
      PyErr_SetString(_PyExc_MemoryError,"");
      py_nodeset_local._4_4_ = -1;
    }
    else {
      memset(pxVar3->nodeTab,0,(long)pxVar3->nodeMax << 3);
      for (pynode._0_4_ = 0; (int)pynode < pxVar3->nodeMax; pynode._0_4_ = (int)pynode + 1) {
        if (bVar1) {
          iVar2 = PyType_HasFeature(py_nodeset->ob_type,0x4000000);
          if (iVar2 == 0) {
            __assert_fail("PyTuple_Check(py_nodeset)",
                          "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                          ,0xcb1,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
          }
          local_48 = (&py_nodeset[1].ob_type)[(int)pynode];
        }
        else {
          iVar2 = PyType_HasFeature(py_nodeset->ob_type,0x2000000);
          if (iVar2 == 0) {
            __assert_fail("PyList_Check(py_nodeset)",
                          "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                          ,0xcb2,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
          }
          local_48 = (PyTypeObject *)
                     (&((py_nodeset[1].ob_type)->ob_base).ob_base.ob_refcnt)[(int)pynode];
        }
        if (local_48 == (PyTypeObject *)&_Py_NoneStruct) {
          local_50 = (xmlNodePtr)0x0;
        }
        else {
          if (bVar1) {
            iVar2 = PyType_HasFeature(py_nodeset->ob_type,0x4000000);
            if (iVar2 == 0) {
              __assert_fail("PyTuple_Check(py_nodeset)",
                            "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                            ,0xcb1,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
            }
            local_58 = (&py_nodeset[1].ob_type)[(int)pynode];
          }
          else {
            iVar2 = PyType_HasFeature(py_nodeset->ob_type,0x2000000);
            if (iVar2 == 0) {
              __assert_fail("PyList_Check(py_nodeset)",
                            "/workspace/llm4binary/github/license_c_cmakelists/aosp-mirror[P]platform_external_libxml2/python/libxml.c"
                            ,0xcb2,"int PyxmlNodeSet_Convert(PyObject *, xmlNodeSetPtr *)");
            }
            local_58 = (PyTypeObject *)
                       (&((py_nodeset[1].ob_type)->ob_base).ob_base.ob_refcnt)[(int)pynode];
          }
          local_50 = (xmlNodePtr)(local_58->ob_base).ob_size;
        }
        if (local_50 != (xmlNodePtr)0x0) {
          iVar2 = pxVar3->nodeNr;
          pxVar3->nodeNr = iVar2 + 1;
          pxVar3->nodeTab[iVar2] = local_50;
        }
      }
      *result = pxVar3;
      py_nodeset_local._4_4_ = 0;
    }
  }
  return py_nodeset_local._4_4_;
}

Assistant:

static int
PyxmlNodeSet_Convert(PyObject *py_nodeset, xmlNodeSetPtr *result)
{
    xmlNodeSetPtr nodeSet;
    int is_tuple = 0;

    if (PyTuple_Check(py_nodeset))
        is_tuple = 1;
    else if (PyList_Check(py_nodeset))
        is_tuple = 0;
    else if (py_nodeset == Py_None) {
        *result = NULL;
        return 0;
    }
    else {
        PyErr_SetString(PyExc_TypeError,
                        "must be a tuple or list of nodes.");
        return -1;
    }

    nodeSet = (xmlNodeSetPtr) xmlMalloc(sizeof(xmlNodeSet));
    if (nodeSet == NULL) {
        PyErr_SetString(PyExc_MemoryError, "");
        return -1;
    }

    nodeSet->nodeNr = 0;
    nodeSet->nodeMax = (is_tuple
                        ? PyTuple_GET_SIZE(py_nodeset)
                        : PyList_GET_SIZE(py_nodeset));
    nodeSet->nodeTab
        = (xmlNodePtr *) xmlMalloc (nodeSet->nodeMax
                                    * sizeof(xmlNodePtr));
    if (nodeSet->nodeTab == NULL) {
        xmlFree(nodeSet);
        PyErr_SetString(PyExc_MemoryError, "");
        return -1;
    }
    memset(nodeSet->nodeTab, 0 ,
           nodeSet->nodeMax * sizeof(xmlNodePtr));

    {
        int idx;
        for (idx=0; idx < nodeSet->nodeMax; ++idx) {
            xmlNodePtr pynode =
                PyxmlNode_Get (is_tuple
                               ? PyTuple_GET_ITEM(py_nodeset, idx)
                               : PyList_GET_ITEM(py_nodeset, idx));
            if (pynode)
                nodeSet->nodeTab[nodeSet->nodeNr++] = pynode;
        }
    }
    *result = nodeSet;
    return 0;
}